

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range.cpp
# Opt level: O1

void duckdb::ListRangeFunction<duckdb::NumericRangeInfo,false>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  ulong *puVar1;
  data_ptr_t pdVar2;
  data_ptr_t pdVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  byte bVar5;
  element_type *peVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  bool bVar8;
  reference pvVar9;
  uint64_t uVar10;
  TemplatedValidityData<unsigned_long> *pTVar11;
  Vector *pVVar12;
  long lVar13;
  uint64_t *puVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  long lVar18;
  ulong uVar19;
  idx_t idx_in_entry;
  ulong uVar20;
  long lVar21;
  size_type __n;
  idx_t required_capacity;
  INCREMENT_TYPE *data_1;
  TYPE *data;
  RangeInfoStruct<duckdb::NumericRangeInfo,_false> info;
  VectorType local_154;
  element_type *local_148;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_140;
  DataChunk *local_138;
  SelectionVector *local_130;
  data_ptr_t local_128;
  data_ptr_t local_120;
  idx_t local_118;
  RangeInfoStruct<duckdb::NumericRangeInfo,_false> local_110;
  
  RangeInfoStruct<duckdb::NumericRangeInfo,_false>::RangeInfoStruct(&local_110,args);
  uVar19 = 1;
  local_154 = CONSTANT_VECTOR;
  local_138 = args;
  if ((args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
      super__Vector_impl_data._M_start) {
    __n = 0;
    do {
      pvVar9 = vector<duckdb::Vector,_true>::operator[](&args->data,__n);
      if (pvVar9->vector_type != CONSTANT_VECTOR) {
        uVar19 = args->count;
        local_154 = FLAT_VECTOR;
        break;
      }
      __n = __n + 1;
    } while (__n < (ulong)(((long)(args->data).
                                  super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                  super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(args->data).
                                  super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                  super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 3) *
                          0x4ec4ec4ec4ec4ec5));
  }
  pdVar2 = result->data;
  FlatVector::VerifyFlatVector(result);
  if (uVar19 == 0) {
    required_capacity = 0;
  }
  else {
    puVar14 = (uint64_t *)(pdVar2 + 8);
    uVar20 = 0;
    required_capacity = 0;
    do {
      bVar8 = RangeInfoStruct<duckdb::NumericRangeInfo,_false>::RowIsValid(&local_110,uVar20);
      if (bVar8) {
        puVar14[-1] = required_capacity;
        uVar10 = RangeInfoStruct<duckdb::NumericRangeInfo,_false>::ListLength(&local_110,uVar20);
        *puVar14 = uVar10;
        required_capacity = required_capacity + uVar10;
      }
      else {
        if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          local_118 = (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)&local_148,&local_118);
          p_Var7 = p_Stack_140;
          peVar6 = local_148;
          local_148 = (element_type *)0x0;
          p_Stack_140 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          p_Var4 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = peVar6;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = p_Var7;
          if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
          }
          if (p_Stack_140 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_140);
          }
          pTVar11 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              (&(result->validity).super_TemplatedValidityMask<unsigned_long>.
                                validity_data);
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
               (unsigned_long *)
               (pTVar11->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>;
        }
        bVar5 = (byte)uVar20 & 0x3f;
        puVar1 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask +
                 (uVar20 >> 6);
        *puVar1 = *puVar1 & (-2L << bVar5 | 0xfffffffffffffffeU >> 0x40 - bVar5);
        puVar14[-1] = required_capacity;
        *puVar14 = 0;
      }
      uVar20 = uVar20 + 1;
      puVar14 = puVar14 + 2;
    } while (uVar19 != uVar20);
  }
  ListVector::Reserve(result,required_capacity);
  pVVar12 = ListVector::GetEntry(result);
  if (uVar19 != 0) {
    pdVar3 = pVVar12->data;
    lVar13 = (long)((local_110.args)->data).
                   super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                   super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)((local_110.args)->data).
                   super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                   super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                   super__Vector_impl_data._M_start;
    local_120 = local_110.vdata[0].data;
    local_128 = local_110.vdata[2].data;
    local_130 = local_110.vdata[2].sel;
    uVar20 = 0;
    lVar18 = 0;
    do {
      if (lVar13 == 0x68) {
        lVar21 = 0;
      }
      else {
        uVar16 = uVar20;
        if ((local_110.vdata[0].sel)->sel_vector != (sel_t *)0x0) {
          uVar16 = (ulong)(local_110.vdata[0].sel)->sel_vector[uVar20];
        }
        lVar21 = *(long *)(local_110.vdata[0].data + uVar16 * 8);
      }
      lVar17 = 1;
      if (2 < (ulong)((lVar13 >> 3) * 0x4ec4ec4ec4ec4ec5)) {
        uVar16 = uVar20;
        if ((local_110.vdata[2].sel)->sel_vector != (sel_t *)0x0) {
          uVar16 = (ulong)(local_110.vdata[2].sel)->sel_vector[uVar20];
        }
        lVar17 = *(long *)(local_110.vdata[2].data + uVar16 * 8);
      }
      if (*(long *)(pdVar2 + uVar20 * 0x10 + 8) != 0) {
        uVar16 = 0;
        do {
          lVar15 = lVar17;
          if (uVar16 == 0) {
            lVar15 = 0;
          }
          lVar21 = lVar21 + lVar15;
          *(long *)(pdVar3 + uVar16 * 8 + lVar18 * 8) = lVar21;
          uVar16 = uVar16 + 1;
        } while (uVar16 < *(ulong *)(pdVar2 + uVar20 * 0x10 + 8));
        lVar18 = lVar18 + uVar16;
      }
      uVar20 = uVar20 + 1;
    } while (uVar20 != uVar19);
  }
  ListVector::SetListSize(result,required_capacity);
  Vector::SetVectorType(result,local_154);
  Vector::Verify(result,local_138->count);
  lVar13 = 0xd8;
  do {
    p_Var4 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_110.vdata + lVar13 + -8)
    ;
    if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
    }
    if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&local_130 + lVar13) !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&local_130 + lVar13));
    }
    lVar13 = lVar13 + -0x48;
  } while (lVar13 != 0);
  return;
}

Assistant:

static void ListRangeFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	D_ASSERT(result.GetType().id() == LogicalTypeId::LIST);

	RangeInfoStruct<OP, INCLUSIVE_BOUND> info(args);
	idx_t args_size = 1;
	auto result_type = VectorType::CONSTANT_VECTOR;
	for (idx_t i = 0; i < args.ColumnCount(); i++) {
		if (args.data[i].GetVectorType() != VectorType::CONSTANT_VECTOR) {
			args_size = args.size();
			result_type = VectorType::FLAT_VECTOR;
			break;
		}
	}
	auto list_data = FlatVector::GetData<list_entry_t>(result);
	auto &result_validity = FlatVector::Validity(result);
	uint64_t total_size = 0;
	for (idx_t i = 0; i < args_size; i++) {
		if (!info.RowIsValid(i)) {
			result_validity.SetInvalid(i);
			list_data[i].offset = total_size;
			list_data[i].length = 0;
		} else {
			list_data[i].offset = total_size;
			list_data[i].length = info.ListLength(i);
			total_size += list_data[i].length;
		}
	}

	// now construct the child vector of the list
	ListVector::Reserve(result, total_size);
	auto range_data = FlatVector::GetData<typename OP::TYPE>(ListVector::GetEntry(result));
	idx_t total_idx = 0;
	for (idx_t i = 0; i < args_size; i++) {
		typename OP::TYPE start_value = info.StartListValue(i);
		typename OP::INCREMENT_TYPE increment = info.ListIncrementValue(i);

		typename OP::TYPE range_value = start_value;
		for (idx_t range_idx = 0; range_idx < list_data[i].length; range_idx++) {
			if (range_idx > 0) {
				OP::Increment(range_value, increment);
			}
			range_data[total_idx++] = range_value;
		}
	}

	ListVector::SetListSize(result, total_size);
	result.SetVectorType(result_type);

	result.Verify(args.size());
}